

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_magestaff.cpp
# Opt level: O0

int AF_A_MageAttack(VMFrameStack *stack,VMValue *param,int numparam,VMReturn *ret,int numret)

{
  AActor *actor;
  DObject *this;
  bool bVar1;
  bool local_7a;
  bool local_77;
  FSoundID local_74;
  TAngle<double> local_70;
  TAngle<double> local_68;
  TAngle<double> local_60;
  TAngle<double> local_58;
  DAngle angle;
  FStateParamInfo *stateinfo;
  AActor *stateowner;
  AActor *self;
  int paramnum;
  int numret_local;
  VMReturn *ret_local;
  int numparam_local;
  VMValue *param_local;
  VMFrameStack *stack_local;
  
  if (numparam < 1) {
    __assert_fail("(paramnum) < numparam",
                  "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_hexen/a_magestaff.cpp"
                  ,0xfc,"int AF_A_MageAttack(VMFrameStack *, VMValue *, int, VMReturn *, int)");
  }
  bVar1 = false;
  if (((param->field_0).field_3.Type == '\x03') &&
     (bVar1 = true, (param->field_0).field_1.atag != 1)) {
    bVar1 = (param->field_0).field_1.a == (void *)0x0;
  }
  if (bVar1) {
    actor = (AActor *)(param->field_0).field_1.a;
    local_77 = true;
    if (actor != (AActor *)0x0) {
      local_77 = DObject::IsKindOf((DObject *)actor,AActor::RegistrationInfo.MyClass);
    }
    if (local_77 != false) {
      if ((1 < numparam) && (param[1].field_0.field_3.Type != 0xff)) {
        bVar1 = false;
        if ((param[1].field_0.field_3.Type == '\x03') &&
           (bVar1 = true, param[1].field_0.field_1.atag != 1)) {
          bVar1 = param[1].field_0.field_1.a == (void *)0x0;
        }
        if (!bVar1) {
          __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_hexen/a_magestaff.cpp"
                        ,0xfc,"int AF_A_MageAttack(VMFrameStack *, VMValue *, int, VMReturn *, int)"
                       );
        }
        this = (DObject *)param[1].field_0.field_1.a;
        local_7a = true;
        if (this != (DObject *)0x0) {
          local_7a = DObject::IsKindOf(this,AActor::RegistrationInfo.MyClass);
        }
        if (local_7a == false) {
          __assert_fail("stateowner == NULL || stateowner->IsKindOf(RUNTIME_CLASS(AActor))",
                        "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_hexen/a_magestaff.cpp"
                        ,0xfc,"int AF_A_MageAttack(VMFrameStack *, VMValue *, int, VMReturn *, int)"
                       );
        }
      }
      if ((numparam < 3) || (param[2].field_0.field_3.Type == 0xff)) {
        angle.Degrees = 0.0;
      }
      else {
        bVar1 = false;
        if ((param[2].field_0.field_3.Type == '\x03') &&
           (bVar1 = true, param[2].field_0.field_1.atag != 8)) {
          bVar1 = param[2].field_0.field_1.a == (void *)0x0;
        }
        if (!bVar1) {
          __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_STATEINFO || param[paramnum].a == NULL)"
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_hexen/a_magestaff.cpp"
                        ,0xfc,"int AF_A_MageAttack(VMFrameStack *, VMValue *, int, VMReturn *, int)"
                       );
        }
        angle.Degrees = (double)param[2].field_0.field_1.a;
      }
      bVar1 = TObjPtr<AActor>::operator==(&actor->target,(AActor *)0x0);
      if (!bVar1) {
        TAngle<double>::TAngle(&local_58,&(actor->Angles).Yaw);
        TAngle<double>::TAngle(&local_60,&local_58);
        MStaffSpawn2(actor,&local_60);
        TAngle<double>::operator-(&local_68,5.0);
        MStaffSpawn2(actor,&local_68);
        TAngle<double>::operator+(&local_70,5.0);
        MStaffSpawn2(actor,&local_70);
        FSoundID::FSoundID(&local_74,"MageStaffFire");
        S_Sound(actor,1,&local_74,1.0,1.0);
      }
      return 0;
    }
    __assert_fail("self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))",
                  "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_hexen/a_magestaff.cpp"
                  ,0xfc,"int AF_A_MageAttack(VMFrameStack *, VMValue *, int, VMReturn *, int)");
  }
  __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_hexen/a_magestaff.cpp"
                ,0xfc,"int AF_A_MageAttack(VMFrameStack *, VMValue *, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_MageAttack)
{
	PARAM_ACTION_PROLOGUE;

	if (self->target == NULL)
	{
		return 0;
	}
	DAngle angle = self->Angles.Yaw;
	MStaffSpawn2(self, angle);
	MStaffSpawn2(self, angle - 5);
	MStaffSpawn2(self, angle + 5);
	S_Sound(self, CHAN_WEAPON, "MageStaffFire", 1, ATTN_NORM);
	return 0;
}